

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

uint8_t conv_bin2ascii(uint8_t a)

{
  byte a_00;
  byte bVar1;
  uint8_t uVar2;
  uint8_t ret;
  uint8_t a_local;
  
  a_00 = a & 0x3f;
  bVar1 = constant_time_eq_8((ulong)a_00,0x3e);
  uVar2 = constant_time_select_8((ulong)bVar1,'+','/');
  bVar1 = constant_time_lt_args_8(a_00,'>');
  uVar2 = constant_time_select_8((ulong)bVar1,a_00 - 4,uVar2);
  bVar1 = constant_time_lt_args_8(a_00,'4');
  uVar2 = constant_time_select_8((ulong)bVar1,a_00 + 0x47,uVar2);
  bVar1 = constant_time_lt_args_8(a_00,'\x1a');
  uVar2 = constant_time_select_8((ulong)bVar1,a_00 + 0x41,uVar2);
  return uVar2;
}

Assistant:

static uint8_t conv_bin2ascii(uint8_t a) {
  // Since PEM is sometimes used to carry private keys, we encode base64 data
  // itself in constant-time.
  a &= 0x3f;
  uint8_t ret = constant_time_select_8(constant_time_eq_8(a, 62), '+', '/');
  ret =
      constant_time_select_8(constant_time_lt_args_8(a, 62), a - 52 + '0', ret);
  ret =
      constant_time_select_8(constant_time_lt_args_8(a, 52), a - 26 + 'a', ret);
  ret = constant_time_select_8(constant_time_lt_args_8(a, 26), a + 'A', ret);
  return ret;
}